

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O1

int lys_copy_union_leafrefs
              (lys_module *mod,lys_node *parent,lys_type *type,lys_type *prev_new,
              unres_schema *unres)

{
  uint uVar1;
  lys_tpdf *plVar2;
  lys_tpdf *plVar3;
  lys_restr *plVar4;
  lys_node_leaf *plVar5;
  void **ppvVar6;
  LY_DATA_TYPE LVar7;
  uint8_t uVar8;
  uint8_t uVar9;
  undefined2 uVar10;
  byte bVar11;
  int iVar12;
  lys_ext_instance **pplVar13;
  lys_type_bit *plVar14;
  long lVar15;
  ulong uVar16;
  lys_type *new_00;
  lys_type_info *plVar17;
  bool bVar18;
  undefined1 auStack_a8 [8];
  lys_type new;
  lys_ext_instance **local_60;
  lys_ext_instance **ext;
  unres_schema *local_50;
  lys_type *local_48;
  lys_module *local_40;
  byte local_31;
  
  if (prev_new == (lys_type *)0x0) {
    plVar17 = (lys_type_info *)&new.parent;
    new.info.lref.target = (lys_node_leaf *)0x0;
    new.info.dec64.div = 0;
    new.parent = (lys_tpdf *)0x0;
    new.info.bits.bit = (lys_type_bit *)0x0;
    new.ext = (lys_ext_instance **)0x0;
    new.base = LY_TYPE_DER;
    new.value_flags = '\0';
    new.ext_size = '\0';
    new._6_2_ = 0;
    auStack_a8._4_4_ = 0;
    auStack_a8._0_4_ = type->base;
    new_00 = (lys_type *)auStack_a8;
    new.der = (lys_tpdf *)parent;
  }
  else {
    plVar17 = &prev_new->info;
    new_00 = prev_new;
  }
  if (type->der == (lys_tpdf *)0x0) {
    __assert_fail("type->der",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_schema.c"
                  ,0x757,
                  "int lys_copy_union_leafrefs(struct lys_module *, struct lys_node *, struct lys_type *, struct lys_type *, struct unres_schema *)"
                 );
  }
  ext = (lys_ext_instance **)parent;
  local_40 = mod;
  if (type->der->module == (lys_module *)0x0) {
    if (type->base == LY_TYPE_UNION) {
      (plVar17->uni).has_ptr_type = (type->info).uni.has_ptr_type;
      uVar1 = (type->info).bits.count;
      (plVar17->bits).count = uVar1;
      if ((ulong)uVar1 == 0) {
        __assert_fail("prev_new->info.uni.count",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_schema.c"
                      ,0x776,
                      "int lys_copy_union_leafrefs(struct lys_module *, struct lys_node *, struct lys_type *, struct lys_type *, struct unres_schema *)"
                     );
      }
      plVar14 = (lys_type_bit *)calloc((ulong)uVar1,0x40);
      (new_00->info).bits.bit = plVar14;
      if (plVar14 == (lys_type_bit *)0x0) {
        ly_log(local_40->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
               "lys_copy_union_leafrefs");
        return -1;
      }
      local_48 = prev_new;
      local_50 = unres;
      if ((plVar17->bits).count != 0) {
        lVar15 = 0;
        uVar16 = 0;
        do {
          iVar12 = lys_copy_union_leafrefs
                             (local_40,(lys_node *)ext,
                              (lys_type *)((long)&((type->info).bits.bit)->name + lVar15),
                              (lys_type *)((long)&((new_00->info).bits.bit)->name + lVar15),local_50
                             );
          if (iVar12 != 0) {
            return -1;
          }
          uVar16 = uVar16 + 1;
          lVar15 = lVar15 + 0x40;
        } while (uVar16 < (plVar17->bits).count);
      }
      new_00->der = type->der;
      if (local_48 != (lys_type *)0x0) {
        return 0;
      }
      goto LAB_00160de5;
    }
    bVar18 = prev_new != (lys_type *)0x0;
    iVar12 = lys_type_dup(mod,parent,new_00,type,0,0,unres);
  }
  else {
    bVar11 = type->ext_size;
    local_50 = unres;
    local_48 = prev_new;
    iVar12 = lys_ext_dup(mod->ctx,mod,type->ext,bVar11,new_00,LYEXT_PAR_TYPE,&local_60,0,unres);
    if (iVar12 != 0) {
      return -1;
    }
    new.info.str.patterns_pcre = (void **)type;
    local_31 = bVar11;
    if (new_00->ext == (lys_ext_instance **)0x0) {
      new_00->ext = local_60;
      bVar11 = local_31;
    }
    else {
      pplVar13 = (lys_ext_instance **)
                 realloc(new_00->ext,(ulong)(((uint)bVar11 + (uint)new_00->ext_size) * 8));
      if (pplVar13 == (lys_ext_instance **)0x0) {
        ly_log(local_40->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
               "lys_copy_union_leafrefs");
        return -1;
      }
      new_00->ext = pplVar13;
      memcpy(pplVar13 + new_00->ext_size,local_60,(ulong)bVar11 << 3);
      free(local_60);
      bVar11 = local_31 + new_00->ext_size;
    }
    bVar18 = local_48 != (lys_type *)0x0;
    new_00->ext_size = bVar11;
    type = (lys_type *)new.info.str.patterns_pcre;
    iVar12 = lys_copy_union_leafrefs
                       (local_40,(lys_node *)ext,
                        (lys_type *)((long)new.info.str.patterns_pcre[2] + 0x38),new_00,local_50);
  }
  if (bVar18 || iVar12 != 0) {
    return -(uint)(iVar12 != 0);
  }
LAB_00160de5:
  LVar7 = new_00->base;
  uVar8 = new_00->value_flags;
  uVar9 = new_00->ext_size;
  uVar10 = *(undefined2 *)&new_00->field_0x6;
  pplVar13 = new_00->ext;
  plVar2 = new_00->der;
  plVar3 = new_00->parent;
  plVar4 = (new_00->info).binary.length;
  plVar5 = (new_00->info).lref.target;
  ppvVar6 = (new_00->info).str.patterns_pcre;
  (type->info).dec64.div = (new_00->info).dec64.div;
  (type->info).str.patterns_pcre = ppvVar6;
  (type->info).binary.length = plVar4;
  (type->info).lref.target = plVar5;
  type->der = plVar2;
  type->parent = plVar3;
  type->base = LVar7;
  type->value_flags = uVar8;
  type->ext_size = uVar9;
  *(undefined2 *)&type->field_0x6 = uVar10;
  type->ext = pplVar13;
  return 0;
}

Assistant:

int
lys_copy_union_leafrefs(struct lys_module *mod, struct lys_node *parent, struct lys_type *type, struct lys_type *prev_new,
                        struct unres_schema *unres)
{
    struct lys_type new;
    unsigned int i, top_type;
    struct lys_ext_instance **ext;
    uint8_t ext_size;
    void *reloc;

    if (!prev_new) {
        /* this is the "top-level" type, meaning it is a real type and no typedef directly above */
        top_type = 1;

        memset(&new, 0, sizeof new);

        new.base = type->base;
        new.parent = (struct lys_tpdf *)parent;

        prev_new = &new;
    } else {
        /* this is not top-level type, just a type of a typedef */
        top_type = 0;
    }

    assert(type->der);
    if (type->der->module) {
        /* typedef, skip it, but keep the extensions */
        ext_size = type->ext_size;
        if (lys_ext_dup(mod->ctx, mod, type->ext, type->ext_size, prev_new, LYEXT_PAR_TYPE, &ext, 0, unres)) {
            return -1;
        }
        if (prev_new->ext) {
            reloc = realloc(prev_new->ext, (prev_new->ext_size + ext_size) * sizeof *prev_new->ext);
            LY_CHECK_ERR_RETURN(!reloc, LOGMEM(mod->ctx), -1);
            prev_new->ext = reloc;

            memcpy(prev_new->ext + prev_new->ext_size, ext, ext_size * sizeof *ext);
            free(ext);

            prev_new->ext_size += ext_size;
        } else {
            prev_new->ext = ext;
            prev_new->ext_size = ext_size;
        }

        if (lys_copy_union_leafrefs(mod, parent, &type->der->type, prev_new, unres)) {
            return -1;
        }
    } else {
        /* type, just make a deep copy */
        switch (type->base) {
        case LY_TYPE_UNION:
            prev_new->info.uni.has_ptr_type = type->info.uni.has_ptr_type;
            prev_new->info.uni.count = type->info.uni.count;
            /* this cannot be a typedef anymore */
            assert(prev_new->info.uni.count);

            prev_new->info.uni.types = calloc(prev_new->info.uni.count, sizeof *prev_new->info.uni.types);
            LY_CHECK_ERR_RETURN(!prev_new->info.uni.types, LOGMEM(mod->ctx), -1);

            for (i = 0; i < prev_new->info.uni.count; i++) {
                if (lys_copy_union_leafrefs(mod, parent, &(type->info.uni.types[i]), &(prev_new->info.uni.types[i]), unres)) {
                    return -1;
                }
            }

            prev_new->der = type->der;
            break;
        default:
            if (lys_type_dup(mod, parent, prev_new, type, 0, 0, unres)) {
                return -1;
            }
            break;
        }
    }

    if (top_type) {
        memcpy(type, prev_new, sizeof *type);
    }
    return EXIT_SUCCESS;
}